

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::~Builder(Builder *this)

{
  set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *this_00;
  FileMetaData *this_01;
  bool bVar1;
  size_type __n;
  reference __x;
  size_type sVar2;
  reference ppFVar3;
  Builder *local_88;
  FileMetaData *f;
  iterator iStack_48;
  uint32_t i;
  _Self local_40;
  const_iterator it;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> to_unref;
  FileSet *added;
  int level;
  Builder *this_local;
  
  for (added._4_4_ = 0; added._4_4_ < 7; added._4_4_ = added._4_4_ + 1) {
    this_00 = this->levels_[added._4_4_].added_files;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&it);
    __n = std::
          set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
          ::size(this_00);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&it,__n)
    ;
    local_40._M_node =
         (_Base_ptr)
         std::
         set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
         ::begin(this_00);
    while( true ) {
      iStack_48 = std::
                  set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
                  ::end(this_00);
      bVar1 = std::operator!=(&local_40,&stack0xffffffffffffffb8);
      if (!bVar1) break;
      __x = std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator*(&local_40);
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&it,
                 __x);
      std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator++(&local_40);
    }
    if (this_00 !=
        (set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
         *)0x0) {
      std::
      set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
      ::~set(this_00);
      operator_delete(this_00);
    }
    for (f._4_4_ = 0;
        sVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)&it), f._4_4_ < sVar2; f._4_4_ = f._4_4_ + 1) {
      ppFVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)&it,(ulong)f._4_4_);
      this_01 = *ppFVar3;
      this_01->refs = this_01->refs + -1;
      if ((this_01->refs < 1) && (this_01 != (FileMetaData *)0x0)) {
        FileMetaData::~FileMetaData(this_01);
        operator_delete(this_01);
      }
    }
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)&it);
  }
  Version::Unref(this->base_);
  local_88 = this + 1;
  do {
    local_88 = (Builder *)(local_88[-1].levels_ + 6);
    LevelState::~LevelState((LevelState *)local_88);
  } while (local_88 != (Builder *)this->levels_);
  return;
}

Assistant:

~Builder() {
    for (int level = 0; level < config::kNumLevels; level++) {
      const FileSet* added = levels_[level].added_files;
      std::vector<FileMetaData*> to_unref;
      to_unref.reserve(added->size());
      for (FileSet::const_iterator it = added->begin(); it != added->end();
           ++it) {
        to_unref.push_back(*it);
      }
      delete added;
      for (uint32_t i = 0; i < to_unref.size(); i++) {
        FileMetaData* f = to_unref[i];
        f->refs--;
        if (f->refs <= 0) {
          delete f;
        }
      }
    }
    base_->Unref();
  }